

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.h
# Opt level: O0

optional<uuids::uuid> *
uuids::uuid::from_string<char[3]>(optional<uuids::uuid> *__return_storage_ptr__,char (*in_str) [3])

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  bool bVar4;
  uchar uVar5;
  byte bVar6;
  const_reference pvVar7;
  size_type sVar8;
  reference pvVar9;
  byte *pbVar10;
  uuid local_60;
  ulong local_50;
  size_t i;
  array<unsigned_char,_16UL> data;
  size_t index;
  size_t hasBraces;
  undefined1 auStack_20 [7];
  bool firstDigit;
  basic_string_view<char,_std::char_traits<char>_> str;
  char (*in_str_local) [3];
  
  str._M_str = *in_str;
  _auStack_20 = detail::to_string_view<char>(*in_str);
  bVar2 = true;
  data._M_elems[8] = '\0';
  data._M_elems[9] = '\0';
  data._M_elems[10] = '\0';
  data._M_elems[0xb] = '\0';
  data._M_elems[0xc] = '\0';
  data._M_elems[0xd] = '\0';
  data._M_elems[0xe] = '\0';
  data._M_elems[0xf] = '\0';
  memset(&i,0,0x10);
  bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  if (bVar4) {
    std::optional<uuids::uuid>::optional(__return_storage_ptr__);
  }
  else {
    pvVar7 = std::basic_string_view<char,_std::char_traits<char>_>::front
                       ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
    index = (size_t)(*pvVar7 == '{');
    if ((index == 0) ||
       (pvVar7 = std::basic_string_view<char,_std::char_traits<char>_>::back
                           ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20),
       *pvVar7 == '}')) {
      for (local_50 = index; uVar3 = local_50,
          sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20),
          uVar3 < sVar8 - index; local_50 = local_50 + 1) {
        pvVar7 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20,local_50)
        ;
        if (*pvVar7 != '-') {
          if (0xf < (ulong)data._M_elems._8_8_) {
LAB_001f7cff:
            std::optional<uuids::uuid>::optional(__return_storage_ptr__);
            return __return_storage_ptr__;
          }
          pvVar7 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20,
                              local_50);
          bVar4 = detail::is_hex<char>(*pvVar7);
          if (!bVar4) goto LAB_001f7cff;
          bVar2 = !bVar2;
          if (bVar2) {
            pbVar10 = std::array<unsigned_char,_16UL>::operator[]
                                ((array<unsigned_char,_16UL> *)&i,data._M_elems._8_8_);
            bVar1 = *pbVar10;
            pvVar7 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                               ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20,
                                local_50);
            bVar6 = detail::hex2char<char>(*pvVar7);
            pbVar10 = std::array<unsigned_char,_16UL>::operator[]
                                ((array<unsigned_char,_16UL> *)&i,data._M_elems._8_8_);
            *pbVar10 = bVar1 | bVar6;
            data._M_elems._8_8_ = data._M_elems._8_8_ + 1;
          }
          else {
            pvVar7 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                               ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20,
                                local_50);
            uVar5 = detail::hex2char<char>(*pvVar7);
            pvVar9 = std::array<unsigned_char,_16UL>::operator[]
                               ((array<unsigned_char,_16UL> *)&i,data._M_elems._8_8_);
            *pvVar9 = uVar5 << 4;
          }
        }
      }
      if ((ulong)data._M_elems._8_8_ < 0x10) {
        std::optional<uuids::uuid>::optional(__return_storage_ptr__);
      }
      else {
        uuid(&local_60,(array<unsigned_char,_16UL> *)&i);
        std::optional<uuids::uuid>::optional<uuids::uuid,_true>(__return_storage_ptr__,&local_60);
      }
    }
    else {
      std::optional<uuids::uuid>::optional(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] constexpr static std::optional<uuid> from_string(StringType const & in_str) noexcept
      {
         auto str = detail::to_string_view(in_str);
         bool firstDigit = true;
         size_t hasBraces = 0;
         size_t index = 0;

         std::array<uint8_t, 16> data{ { 0 } };

         if (str.empty()) return {};

         if (str.front() == '{')
            hasBraces = 1;
         if (hasBraces && str.back() != '}')
            return {};

         for (size_t i = hasBraces; i < str.size() - hasBraces; ++i)
         {
            if (str[i] == '-') continue;

            if (index >= 16 || !detail::is_hex(str[i]))
            {
               return {};
            }

            if (firstDigit)
            {
               data[index] = static_cast<uint8_t>(detail::hex2char(str[i]) << 4);
               firstDigit = false;
            }
            else
            {
               data[index] = static_cast<uint8_t>(data[index] | detail::hex2char(str[i]));
               index++;
               firstDigit = true;
            }
         }

         if (index < 16)
         {
            return {};
         }

         return uuid{ data };
      }